

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpinfo.c
# Opt level: O0

WebPInfoStatus ParseLosslessHeader(ChunkData *chunk_data,WebPInfo *webp_info)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  uint8_t *data_00;
  WebPInfo *webp_info_00;
  long in_RSI;
  long in_RDI;
  int version;
  int has_alpha;
  int height;
  int width;
  WebPInfoStatus status;
  uint64_t *bit_pos;
  uint64_t bit_position;
  size_t data_size;
  uint8_t *data;
  uint local_4c;
  uint local_48;
  uint local_44;
  int in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint64_t *bit_pos_00;
  uint8_t *data_01;
  WebPInfoStatus local_4;
  
  pcVar1 = *(char **)(in_RDI + 0x10);
  uVar4 = *(long *)(in_RDI + 8) - 8;
  data_01 = (uint8_t *)0x0;
  bit_pos_00 = (uint64_t *)&stack0xffffffffffffffd0;
  printf("  Parsing lossless bitstream...\n");
  if (uVar4 < 5) {
    if (*(int *)(in_RSI + 0x70) != 0) {
      fprintf(_stderr,"Error: %s\n","Truncated lossless bitstream.");
    }
    local_4 = WEBP_INFO_TRUNCATED_DATA;
  }
  else if (*pcVar1 == '/') {
    data_00 = (uint8_t *)(pcVar1 + 1);
    webp_info_00 = (WebPInfo *)(uVar4 - 1);
    iVar2 = LLGetBits(data_00,(size_t)webp_info_00,0xe,(int *)&stack0xffffffffffffffc0,bit_pos_00);
    if (iVar2 == 0) {
      if (*(int *)(in_RSI + 0x70) != 0) {
        fprintf(_stderr,"Error: %s\n","Truncated lossless bitstream.");
      }
      local_4 = WEBP_INFO_TRUNCATED_DATA;
    }
    else {
      iVar2 = LLGetBits(data_00,(size_t)webp_info_00,0xe,(int *)&local_44,bit_pos_00);
      if (iVar2 == 0) {
        if (*(int *)(in_RSI + 0x70) != 0) {
          fprintf(_stderr,"Error: %s\n","Truncated lossless bitstream.");
        }
        local_4 = WEBP_INFO_TRUNCATED_DATA;
      }
      else {
        iVar2 = LLGetBits(data_00,(size_t)webp_info_00,1,(int *)&local_48,bit_pos_00);
        if (iVar2 == 0) {
          if (*(int *)(in_RSI + 0x70) != 0) {
            fprintf(_stderr,"Error: %s\n","Truncated lossless bitstream.");
          }
          local_4 = WEBP_INFO_TRUNCATED_DATA;
        }
        else {
          iVar2 = LLGetBits(data_00,(size_t)webp_info_00,3,(int *)&local_4c,bit_pos_00);
          if (iVar2 == 0) {
            if (*(int *)(in_RSI + 0x70) != 0) {
              fprintf(_stderr,"Error: %s\n","Truncated lossless bitstream.");
            }
            local_4 = WEBP_INFO_TRUNCATED_DATA;
          }
          else {
            uVar3 = in_stack_ffffffffffffffc0 + 1;
            local_44 = local_44 + 1;
            printf("  Width:            %d\n",(ulong)uVar3);
            printf("  Height:           %d\n",(ulong)local_44);
            printf("  Alpha:            %d\n",(ulong)local_48);
            printf("  Version:          %d\n",(ulong)local_4c);
            local_4 = ParseLosslessTransform
                                (webp_info_00,data_01,(size_t)bit_pos_00,
                                 (uint64_t *)CONCAT44(in_stack_ffffffffffffffc4,uVar3));
            if (local_4 == WEBP_INFO_OK) {
              local_4 = WEBP_INFO_OK;
            }
          }
        }
      }
    }
  }
  else {
    if (*(int *)(in_RSI + 0x70) != 0) {
      fprintf(_stderr,"Error: %s\n","Invalid lossless bitstream signature.");
    }
    local_4 = WEBP_INFO_BITSTREAM_ERROR;
  }
  return local_4;
}

Assistant:

static WebPInfoStatus ParseLosslessHeader(const ChunkData* const chunk_data,
                                          WebPInfo* const webp_info) {
  const uint8_t* data = chunk_data->payload;
  size_t data_size = chunk_data->size - CHUNK_HEADER_SIZE;
  uint64_t bit_position = 0;
  uint64_t* const bit_pos = &bit_position;
  WebPInfoStatus status;
  printf("  Parsing lossless bitstream...\n");
  if (data_size < VP8L_FRAME_HEADER_SIZE) {
    LOG_ERROR("Truncated lossless bitstream.");
    return WEBP_INFO_TRUNCATED_DATA;
  }
  if (data[0] != VP8L_MAGIC_BYTE) {
    LOG_ERROR("Invalid lossless bitstream signature.");
    return WEBP_INFO_BITSTREAM_ERROR;
  }
  data += 1;
  data_size -= 1;
  {
    int width, height, has_alpha, version;
    LL_GET_BITS(width, 14);
    LL_GET_BITS(height, 14);
    LL_GET_BITS(has_alpha, 1);
    LL_GET_BITS(version, 3);
    width += 1;
    height += 1;
    printf("  Width:            %d\n", width);
    printf("  Height:           %d\n", height);
    printf("  Alpha:            %d\n", has_alpha);
    printf("  Version:          %d\n", version);
  }
  status = ParseLosslessTransform(webp_info, data, data_size, bit_pos);
  if (status != WEBP_INFO_OK) return status;
  return WEBP_INFO_OK;
}